

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O0

void __thiscall nvim::Nvim::del_keymap(Nvim *this,string *mode,string *lhs)

{
  allocator local_41;
  string local_40;
  string *local_20;
  string *lhs_local;
  string *mode_local;
  Nvim *this_local;
  
  local_20 = lhs;
  lhs_local = mode;
  mode_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"nvim_del_keymap",&local_41);
  NvimRPC::call<std::__cxx11::string,std::__cxx11::string>
            (&this->client_,&local_40,(nullptr_t)0x0,lhs_local,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

void Nvim::del_keymap(const std::string& mode, const std::string& lhs) {
    client_.call("nvim_del_keymap", nullptr, mode, lhs);
}